

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerSharedInputState.hpp
# Opt level: O0

void __thiscall antlr::LexerInputState::~LexerInputState(LexerInputState *this)

{
  LexerInputState *in_RDI;
  
  ~LexerInputState(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

virtual ~LexerInputState()
	{
		if (inputResponsible)
			delete input;
	}